

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

void __thiscall hta::Directory::Directory(Directory *this,json *config,bool use_mutex)

{
  _Head_base<0UL,_hta::storage::Directory_*,_false> _Var1;
  pointer pbVar2;
  const_reference pvVar3;
  size_type sVar4;
  reference this_00;
  undefined7 in_register_00000011;
  bool bVar5;
  pair<hta::Metric_&,_bool> pVar6;
  allocator<char> local_131;
  vector<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::allocator<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
  *local_130;
  iteration_proxy_internal __begin2;
  iteration_proxy_internal __end2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type;
  iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->directory_)._M_t.
  super___uniq_ptr_impl<hta::storage::Directory,_std::default_delete<hta::storage::Directory>_>._M_t
  .super__Tuple_impl<0UL,_hta::storage::Directory_*,_std::default_delete<hta::storage::Directory>_>.
  super__Head_base<0UL,_hta::storage::Directory_*,_false>._M_head_impl = (Directory *)0x0;
  (this->metrics_)._M_h._M_buckets = &(this->metrics_)._M_h._M_single_bucket;
  (this->metrics_)._M_h._M_bucket_count = 1;
  (this->metrics_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->metrics_)._M_h._M_element_count = 0;
  (this->metrics_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->metrics_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->metrics_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->prefixes_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->prefixes_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->prefixes_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar5 = (int)CONCAT71(in_register_00000011,use_mutex) != 0;
  if (bVar5) {
    *(undefined8 *)
     ((long)&(this->mutex_).mutex_.super__Optional_base<std::mutex,_false,_false>._M_payload.
             super__Optional_payload_base<std::mutex>._M_payload + 0x10) = 0;
    *(undefined8 *)
     ((long)&(this->mutex_).mutex_.super__Optional_base<std::mutex,_false,_false>._M_payload.
             super__Optional_payload_base<std::mutex>._M_payload + 0x18) = 0;
    *(undefined8 *)
     &(this->mutex_).mutex_.super__Optional_base<std::mutex,_false,_false>._M_payload.
      super__Optional_payload_base<std::mutex>._M_payload = 0;
    *(undefined8 *)
     ((long)&(this->mutex_).mutex_.super__Optional_base<std::mutex,_false,_false>._M_payload.
             super__Optional_payload_base<std::mutex>._M_payload + 8) = 0;
    *(undefined8 *)
     ((long)&(this->mutex_).mutex_.super__Optional_base<std::mutex,_false,_false>._M_payload.
             super__Optional_payload_base<std::mutex>._M_payload + 0x20) = 0;
  }
  local_130 = (vector<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::allocator<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
               *)&this->prefixes_;
  (this->mutex_).mutex_.super__Optional_base<std::mutex,_false,_false>._M_payload.
  super__Optional_payload_base<std::mutex>._M_engaged = bVar5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__begin2,"type",(allocator<char> *)&__end2);
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(config,(key_type *)&__begin2);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&type,pvVar3);
  std::__cxx11::string::~string((string *)&__begin2);
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type
                          ,"file");
  if (!bVar5) {
    std::__cxx11::string::string((string *)&local_50,(string *)&type);
    throw_exception<hta::Exception,char_const*,std::__cxx11::string>
              ("Unknown directory type: ",&local_50);
  }
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)config,"path");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin2,pvVar3);
  std::make_unique<hta::storage::file::Directory,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end2);
  pbVar2 = __end2.anchor.m_object;
  __end2.anchor.m_object = (pointer)0x0;
  _Var1._M_head_impl =
       (this->directory_)._M_t.
       super___uniq_ptr_impl<hta::storage::Directory,_std::default_delete<hta::storage::Directory>_>
       ._M_t.
       super__Tuple_impl<0UL,_hta::storage::Directory_*,_std::default_delete<hta::storage::Directory>_>
       .super__Head_base<0UL,_hta::storage::Directory_*,_false>._M_head_impl;
  (this->directory_)._M_t.
  super___uniq_ptr_impl<hta::storage::Directory,_std::default_delete<hta::storage::Directory>_>._M_t
  .super__Tuple_impl<0UL,_hta::storage::Directory_*,_std::default_delete<hta::storage::Directory>_>.
  super__Head_base<0UL,_hta::storage::Directory_*,_false>._M_head_impl = (Directory *)pbVar2;
  if ((_Var1._M_head_impl != (Directory *)0x0) &&
     ((*(_Var1._M_head_impl)->_vptr_Directory[2])(), __end2.anchor.m_object != (pointer)0x0)) {
    (**(code **)(*(long *)__end2.anchor.m_object + 0x10))();
  }
  __end2.anchor.m_object = (pointer)0x0;
  std::__cxx11::string::~string((string *)&__begin2);
  sVar4 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::count<char_const(&)[8]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      *)config,(char (*) [8])"metrics");
  if (sVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin2,"metrics",(allocator<char> *)&__end2);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(config,(key_type *)&__begin2);
    std::__cxx11::string::~string((string *)&__begin2);
    if (pvVar3->m_type != object) {
      __assert_fail("metrics.is_object()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/directory.cpp"
                    ,0x65,"hta::Directory::Directory(const json &, bool)");
    }
    local_b8.container = pvVar3;
    nlohmann::detail::
    iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    ::begin(&__begin2,&local_b8);
    nlohmann::detail::
    iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    ::end(&__end2,&local_b8);
    while (bVar5 = nlohmann::detail::
                   iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   ::iteration_proxy_internal::operator!=(&__begin2,&__end2), bVar5) {
      nlohmann::detail::
      iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      ::iteration_proxy_internal::key(&name,&__begin2);
      this_00 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::operator*(&__begin2.anchor);
      sVar4 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::count<char_const(&)[7]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)this_00,(char (*) [7])"prefix");
      if (sVar4 == 0) {
LAB_00150f55:
        pVar6 = emplace(this,&name,this_00);
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::__cxx11::string::string((string *)&local_b0,(string *)&name);
          throw_exception<hta::Exception,char_const*,std::__cxx11::string>
                    ("duplicated metric name in initial configuration: ",&local_b0);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"prefix",&local_131);
        pvVar3 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::at(this_00,(key_type *)&local_90);
        bVar5 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<bool,_bool,_0>(pvVar3);
        std::__cxx11::string::~string((string *)&local_90);
        if (!bVar5) goto LAB_00150f55;
        std::operator+(&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                       ".");
        std::
        vector<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::allocator<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
        ::
        emplace_back<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&>
                  (local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                   this_00);
        std::__cxx11::string::~string((string *)&local_90);
      }
      std::__cxx11::string::~string((string *)&name);
      nlohmann::detail::
      iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      ::iteration_proxy_internal::operator++(&__begin2);
    }
  }
  std::__cxx11::string::~string((string *)&type);
  return;
}

Assistant:

Directory::Directory(const json& config, bool use_mutex) : mutex_(use_mutex)
{
    auto type = config.at("type").get<std::string>();
    if (type == "file")
    {
        directory_ = std::make_unique<storage::file::Directory>(config["path"].get<std::string>());
    }
    else
    {
        throw_exception("Unknown directory type: ", type);
    }

    if (config.count("metrics"))
    {
        auto& metrics = config.at("metrics");
        assert(metrics.is_object());
        for (const auto& elem : metrics.items())
        {
            std::string name = elem.key();
            const auto& metric_config = elem.value();
            if (metric_config.count("prefix") && metric_config.at("prefix").get<bool>())
            {
                // TODO check for overlapping prefixes
                // add . to end
                prefixes_.emplace_back(name + ".", metric_config);
            }
            else
            {
                const auto& [metric, inserted] = emplace(name, metric_config);
                (void)metric;
                if (!inserted)
                {
                    throw_exception("duplicated metric name in initial configuration: ", name);
                }
            }
        }
    }
}